

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

TypeBase ** __thiscall
SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::find
          (SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U> *this,
          TypeModulePair *key)

{
  Node *this_00;
  Node *pNVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  TypeBase **local_58;
  InplaceStr local_48;
  ModuleData *local_38;
  
  uVar5 = this->bucketCount;
  uVar3 = NULLC::GetStringHash((key->typeName).begin,(key->typeName).end);
  uVar4 = NULLC::GetStringHash((key->importModule->name).begin,(key->importModule->name).end);
  if (this->bucketCount != 0) {
    uVar5 = uVar5 - 1;
    uVar4 = uVar4 + uVar3 & uVar5;
    uVar3 = 0;
    do {
      pNVar1 = this->data;
      this_00 = pNVar1 + uVar4;
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      local_38 = (ModuleData *)0x0;
      bVar2 = InplaceStr::operator==((InplaceStr *)this_00,&local_48);
      if ((bVar2) && (pNVar1[uVar4].key.importModule == local_38)) {
        bVar2 = false;
        local_58 = (TypeBase **)0x0;
      }
      else {
        bVar2 = InplaceStr::operator==((InplaceStr *)this_00,&key->typeName);
        if ((bVar2) && ((this_00->key).importModule == key->importModule)) {
          local_58 = &this_00->value;
          bVar2 = false;
        }
        else {
          uVar4 = uVar4 + uVar3 + 1 & uVar5;
          bVar2 = true;
        }
      }
      if (!bVar2) {
        return local_58;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->bucketCount);
  }
  return (TypeBase **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}